

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::MockCodeGenerator::Generate
          (MockCodeGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  ushort uVar1;
  ServiceDescriptor *pSVar2;
  string_view file_name;
  string_view file_name_00;
  string_view file_name_01;
  string *psVar3;
  bool bVar4;
  Edition EVar5;
  int iVar6;
  int iVar7;
  SourceCodeInfo *p;
  MessageLite *pMVar8;
  ulong uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ZeroCopyOutputStream *pZVar10;
  void *pvVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar12;
  Descriptor *pDVar13;
  FieldDescriptor *this_00;
  LogMessage *pLVar14;
  AnnotationCollector *annotation_collector_00;
  Nonnull<std::string_*> pbVar15;
  Arena *pAVar16;
  long *plVar17;
  anon_union_64_1_493b367e_for_FeatureSet_53 *paVar18;
  long lVar19;
  ExtensionSet *this_01;
  DescriptorNames *pDVar20;
  ulong uVar21;
  ZeroCopyOutputStream *pZVar22;
  char *pcVar23;
  int *__s1;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __s1_00;
  size_type __rlen;
  size_t __n;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  string_view text;
  string_view begin_varname;
  string_view text_00;
  string_view begin_varname_00;
  string_view text_01;
  string_view begin_varname_01;
  FixedMapping replacements;
  string_view value;
  FixedMapping replacements_00;
  string_view value_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view v;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view sVar31;
  string_view generator_name;
  string_view generator_name_00;
  string_view generator_name_01;
  string_view parameter_00;
  string_view parameter_01;
  string_view parameter_02;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string annotate_suffix;
  GeneratedCodeInfo info;
  GeneratedCodeInfo annotations;
  Version compiler_version;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratorContext *in_stack_fffffffffffffce0;
  undefined1 local_300 [48];
  undefined1 local_2d0 [32];
  string *local_2b0;
  undefined8 local_2a8;
  undefined1 local_2a0 [48];
  GeneratedCodeInfo local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_240;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_238;
  undefined1 *local_230;
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  *local_228;
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  *local_220;
  undefined1 local_218 [48];
  undefined1 local_1e8 [152];
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_150;
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_138;
  undefined1 local_118 [32];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  ulong local_b8;
  AlphaNum local_b0;
  string local_80;
  string local_60;
  AnnotationCollector local_40;
  GeneratedCodeInfo *local_38;
  AlphaNum *c;
  
  local_2b0 = error;
  local_2a8 = parameter;
  sVar31 = anon_unknown_0::GetTestCase();
  plVar17 = (long *)sVar31._M_str;
  if (sVar31._M_len == 0xb) {
    if (*(long *)((long)plVar17 + 3) == 0x6d756d6978616d5f && *plVar17 == 0x6978616d5f776f6c) {
      this->maximum_edition_ = EDITION_PROTO2;
    }
  }
  else if ((sVar31._M_len == 0xc) &&
          ((int)plVar17[1] == 0x6d756d69 && *plVar17 == 0x6e696d5f68676968)) {
    this->minimum_edition_ = EDITION_99997_TEST_ONLY;
  }
  EVar5 = FileDescriptor::edition(file);
  if ((999 < (int)EVar5) && ((this->suppressed_features_ & 2) == 0)) {
    paVar18 = &file->merged_features_->field_0;
    bVar4 = internal::ExtensionSet::Has(&(paVar18->_impl_)._extensions_,pb::test);
    if (!bVar4) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xec,"features.HasExtension(pb::test)");
      sVar31._M_str = "Test features were not resolved properly";
      sVar31._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)local_1e8,sVar31);
LAB_001bd38d:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_1e8);
    }
    pMVar8 = internal::ExtensionSet::GetMessage
                       (&(paVar18->_impl_)._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__00575ea8);
    if (((ulong)pMVar8[1]._vptr_MessageLite & 1) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xee,"features.GetExtension(pb::test).has_file_feature()");
      str_10._M_str = "Test features were not resolved properly";
      str_10._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)local_1e8,str_10);
      goto LAB_001bd38d;
    }
    pDVar13 = (Descriptor *)(ulong)pb::test;
    pMVar8 = internal::ExtensionSet::GetMessage
                       (&(paVar18->_impl_)._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__00575ea8);
    if (((ulong)pMVar8[1]._vptr_MessageLite & 0x800) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
      str_11._M_str = "Test features were not resolved properly";
      str_11._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)local_1e8,str_11);
      goto LAB_001bd38d;
    }
    if (0 < file->message_type_count_) {
      lVar19 = 0;
      lVar24 = 0;
      do {
        internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(&file->message_types_->super_SymbolBase + lVar19),pDVar13);
        lVar24 = lVar24 + 1;
        lVar19 = lVar19 + 0xa0;
      } while (lVar24 < file->message_type_count_);
    }
    if (0 < file->enum_type_count_) {
      lVar19 = 0;
      lVar24 = 0;
      do {
        internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(&file->enum_types_->super_SymbolBase + lVar19),(EnumDescriptor *)pDVar13);
        lVar24 = lVar24 + 1;
        lVar19 = lVar19 + 0x58;
      } while (lVar24 < file->enum_type_count_);
    }
    if (0 < file->extension_count_) {
      lVar19 = 0x48;
      lVar24 = 0;
      do {
        internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
        ::Visit<>(*(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                    **)(&file->extensions_->super_SymbolBase + lVar19),(FieldDescriptor *)pDVar13);
        lVar24 = lVar24 + 1;
        lVar19 = lVar19 + 0x58;
      } while (lVar24 < file->extension_count_);
    }
    if (0 < file->service_count_) {
      lVar19 = 0;
      do {
        pSVar2 = file->services_;
        paVar18 = &(pSVar2[lVar19].merged_features_)->field_0;
        bVar4 = internal::ExtensionSet::Has(&(paVar18->_impl_)._extensions_,pb::test);
        if (!bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xec,"features.HasExtension(pb::test)");
          str_07._M_str = "Test features were not resolved properly";
          str_07._M_len = 0x28;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_1e8,str_07);
          goto LAB_001bd38d;
        }
        pMVar8 = internal::ExtensionSet::GetMessage
                           (&(paVar18->_impl_)._extensions_,pb::test,
                            (MessageLite *)PTR__TestFeatures_default_instance__00575ea8);
        if (((ulong)pMVar8[1]._vptr_MessageLite & 1) == 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xee,"features.GetExtension(pb::test).has_file_feature()");
          str_08._M_str = "Test features were not resolved properly";
          str_08._M_len = 0x28;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_1e8,str_08);
          goto LAB_001bd38d;
        }
        pMVar8 = internal::ExtensionSet::GetMessage
                           (&(paVar18->_impl_)._extensions_,pb::test,
                            (MessageLite *)PTR__TestFeatures_default_instance__00575ea8);
        if (((ulong)pMVar8[1]._vptr_MessageLite & 0x800) == 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
          str_09._M_str = "Test features were not resolved properly";
          str_09._M_len = 0x28;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_1e8,str_09);
          goto LAB_001bd38d;
        }
        if (0 < pSVar2[lVar19].method_count_) {
          lVar24 = 0x48;
          lVar25 = 0;
          do {
            this_01 = (ExtensionSet *)
                      (*(long *)(&(pSVar2[lVar19].methods_)->super_SymbolBase + lVar24) + 0x10);
            bVar4 = internal::ExtensionSet::Has(this_01,pb::test);
            if (!bVar4) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0xec,"features.HasExtension(pb::test)");
              str._M_str = "Test features were not resolved properly";
              str._M_len = 0x28;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)local_1e8,str);
              goto LAB_001bd38d;
            }
            pMVar8 = internal::ExtensionSet::GetMessage
                               (this_01,pb::test,
                                (MessageLite *)PTR__TestFeatures_default_instance__00575ea8);
            if (((ulong)pMVar8[1]._vptr_MessageLite & 1) == 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0xee,"features.GetExtension(pb::test).has_file_feature()");
              str_00._M_str = "Test features were not resolved properly";
              str_00._M_len = 0x28;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)local_1e8,str_00);
              goto LAB_001bd38d;
            }
            pMVar8 = internal::ExtensionSet::GetMessage
                               (this_01,pb::test,
                                (MessageLite *)PTR__TestFeatures_default_instance__00575ea8);
            if (((ulong)pMVar8[1]._vptr_MessageLite & 0x800) == 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
              str_01._M_str = "Test features were not resolved properly";
              str_01._M_len = 0x28;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)local_1e8,str_01);
              goto LAB_001bd38d;
            }
            lVar25 = lVar25 + 1;
            lVar24 = lVar24 + 0x50;
          } while (lVar25 < pSVar2[lVar19].method_count_);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < file->service_count_);
    }
  }
  iVar7 = file->message_type_count_;
  if ((long)iVar7 < 1) {
    uVar21 = 0;
  }
  else {
    pDVar20 = &file->message_types_->all_names_;
    lVar19 = 0;
    uVar21 = 0;
    do {
      uVar1 = *(ushort *)pDVar20->payload_;
      uVar9 = (ulong)uVar1;
      if (0x11 < uVar9) {
        pcVar23 = (char *)((long)pDVar20->payload_ + ~uVar9);
        auVar26[0] = -(*pcVar23 == 'M');
        auVar26[1] = -(pcVar23[1] == 'o');
        auVar26[2] = -(pcVar23[2] == 'c');
        auVar26[3] = -(pcVar23[3] == 'k');
        auVar26[4] = -(pcVar23[4] == 'C');
        auVar26[5] = -(pcVar23[5] == 'o');
        auVar26[6] = -(pcVar23[6] == 'd');
        auVar26[7] = -(pcVar23[7] == 'e');
        auVar26[8] = -(pcVar23[8] == 'G');
        auVar26[9] = -(pcVar23[9] == 'e');
        auVar26[10] = -(pcVar23[10] == 'n');
        auVar26[0xb] = -(pcVar23[0xb] == 'e');
        auVar26[0xc] = -(pcVar23[0xc] == 'r');
        auVar26[0xd] = -(pcVar23[0xd] == 'a');
        auVar26[0xe] = -(pcVar23[0xe] == 't');
        auVar26[0xf] = -(pcVar23[0xf] == 'o');
        auVar29[0] = -((char)*(undefined2 *)(pcVar23 + 0x10) == 'r');
        auVar29[1] = -((char)((ushort)*(undefined2 *)(pcVar23 + 0x10) >> 8) == '_');
        auVar29[2] = 0xff;
        auVar29[3] = 0xff;
        auVar29[4] = 0xff;
        auVar29[5] = 0xff;
        auVar29[6] = 0xff;
        auVar29[7] = 0xff;
        auVar29[8] = 0xff;
        auVar29[9] = 0xff;
        auVar29[10] = 0xff;
        auVar29[0xb] = 0xff;
        auVar29[0xc] = 0xff;
        auVar29[0xd] = 0xff;
        auVar29[0xe] = 0xff;
        auVar29[0xf] = 0xff;
        auVar29 = auVar29 & auVar26;
        if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff) {
          __n = uVar9 - 0x12;
          __s1 = (int *)(pcVar23 + 0x12);
          if (uVar9 == 0x1a) {
            iVar6 = bcmp(__s1,"Annotate",__n);
            uVar21 = 1;
            if (iVar6 == 0) goto LAB_001bba4e;
            if (__n == 0x11) {
LAB_001bcd7f:
              auVar28[0] = -((char)*__s1 == 'S');
              auVar28[1] = -(pcVar23[0x13] == 'h');
              auVar28[2] = -(pcVar23[0x14] == 'o');
              auVar28[3] = -(pcVar23[0x15] == 'w');
              auVar28[4] = -(pcVar23[0x16] == 'V');
              auVar28[5] = -(pcVar23[0x17] == 'e');
              auVar28[6] = -(pcVar23[0x18] == 'r');
              auVar28[7] = -(pcVar23[0x19] == 's');
              auVar28[8] = -(pcVar23[0x1a] == 'i');
              auVar28[9] = -(pcVar23[0x1b] == 'o');
              auVar28[10] = -(pcVar23[0x1c] == 'n');
              auVar28[0xb] = -(pcVar23[0x1d] == 'N');
              auVar28[0xc] = -(pcVar23[0x1e] == 'u');
              auVar28[0xd] = -(pcVar23[0x1f] == 'm');
              auVar28[0xe] = -(pcVar23[0x20] == 'b');
              auVar28[0xf] = -(pcVar23[0x21] == 'e');
              auVar30[0] = -(pcVar23[0x22] == 'r');
              auVar30[1] = 0xff;
              auVar30[2] = 0xff;
              auVar30[3] = 0xff;
              auVar30[4] = 0xff;
              auVar30[5] = 0xff;
              auVar30[6] = 0xff;
              auVar30[7] = 0xff;
              auVar30[8] = 0xff;
              auVar30[9] = 0xff;
              auVar30[10] = 0xff;
              auVar30[0xb] = 0xff;
              auVar30[0xc] = 0xff;
              auVar30[0xd] = 0xff;
              auVar30[0xe] = 0xff;
              auVar30[0xf] = 0xff;
              auVar30 = auVar30 & auVar28;
              __n = 0x11;
              if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
                Version::Version((Version *)local_1e8,(Arena *)0x0);
                (*context->_vptr_GeneratorContext[7])(context,(Version *)local_1e8);
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_300,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                           ,0x117);
                str_03._M_str = "Saw compiler_version: ";
                str_03._M_len = 0x16;
                absl::lts_20250127::log_internal::LogMessage::
                CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                          ((LogMessage *)local_300,str_03);
                local_b0.piece_._M_len =
                     CONCAT44(local_b0.piece_._M_len._4_4_,
                              local_1e8._36_4_ * 1000 + local_1e8._32_4_ * 1000000 +
                              local_1e8._40_4_);
                pLVar14 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                                    ((LogMessage *)local_300,(int *)&local_b0);
                str_04._M_str = " ";
                str_04._M_len = 1;
                absl::lts_20250127::log_internal::LogMessage::
                CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                          (pLVar14,str_04);
                absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar14,(string *)(local_1e8._24_8_ & 0xfffffffffffffffc));
LAB_001bd0e0:
                absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)local_300);
              }
            }
          }
          else if (uVar1 < 0x1d) {
            if (uVar1 == 0x17) {
              if (pcVar23[0x16] == 'r' && *__s1 == 0x6f727245) {
                std::__cxx11::string::_M_replace
                          ((ulong)local_2b0,0,(char *)local_2b0->_M_string_length,0x3aeb44);
                return false;
              }
              iVar7 = bcmp(__s1,"Abort",__n);
              if (iVar7 == 0) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                           ,0x102,"command != \"Abort\"");
                str_05._M_str = "Saw message type MockCodeGenerator_Abort.";
                str_05._M_len = 0x29;
                absl::lts_20250127::log_internal::LogMessage::
                CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                          ((LogMessage *)local_1e8,str_05);
                goto LAB_001bd38d;
              }
            }
            else if ((uVar1 == 0x16) && (iVar7 = bcmp(__s1,"Exit",__n), iVar7 == 0)) {
              poVar12 = std::operator<<((ostream *)&std::cerr,
                                        "Saw message type MockCodeGenerator_Exit.");
              std::endl<char,std::char_traits<char>>(poVar12);
              exit(0x7b);
            }
          }
          else if (uVar1 == 0x1d) {
            iVar7 = bcmp(__s1,"HasJsonName",__n);
            if (iVar7 == 0) {
              FieldDescriptorProto::FieldDescriptorProto
                        ((FieldDescriptorProto *)local_1e8,(Arena *)0x0);
              pDVar13 = FileDescriptor::message_type(file,(int)lVar19);
              this_00 = Descriptor::field(pDVar13,0);
              FieldDescriptor::CopyTo(this_00,(FieldDescriptorProto *)local_1e8);
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_300,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0x110);
              str_02._M_str = "Saw json_name: ";
              str_02._M_len = 0xf;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)local_300,str_02);
              absl::lts_20250127::log_internal::LogMessage::operator<<
                        ((LogMessage *)local_300,SUB41((local_1e8._16_4_ & 0x10) >> 4,0));
              goto LAB_001bd0e0;
            }
          }
          else if (uVar1 == 0x23) {
            iVar7 = bcmp(__s1,"HasSourceCodeInfo",__n);
            if (iVar7 == 0) {
              FileDescriptorProto::FileDescriptorProto
                        ((FileDescriptorProto *)local_1e8,(Arena *)0x0);
              FileDescriptor::CopySourceCodeInfoTo(file,(FileDescriptorProto *)local_1e8);
              if (((SourceCodeInfo *)local_118._24_8_ == (SourceCodeInfo *)0x0 &
                  (byte)local_1e8._16_4_ >> 4) == 1) {
                internal::protobuf_assumption_failed
                          ("!value || _impl_.source_code_info_ != nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                           ,0x33e3);
              }
              if ((local_1e8._16_4_ & 0x10) == 0) {
                bVar4 = false;
              }
              else {
                if ((SourceCodeInfo *)local_118._24_8_ == (SourceCodeInfo *)0x0) {
                  local_118._24_8_ = _SourceCodeInfo_default_instance_;
                }
                bVar4 = 0 < *(int *)((long)&((SourceCodeInfo *)local_118._24_8_)->field_0 + 0x20);
              }
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_300,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0x10a);
              str_12._M_str = "Saw message type MockCodeGenerator_HasSourceCodeInfo: ";
              str_12._M_len = 0x36;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)local_300,str_12);
              local_b0.piece_._M_len = CONCAT71(local_b0.piece_._M_len._1_7_,bVar4);
              pLVar14 = absl::lts_20250127::log_internal::LogMessage::operator<<<bool,_0>
                                  ((LogMessage *)local_300,(bool *)&local_b0);
              absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar14,(char (*) [2])0x40fa72);
              goto LAB_001bd0e0;
            }
            goto LAB_001bcd7f;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0x11d);
          str_06._M_str = "Unknown MockCodeGenerator command: ";
          str_06._M_len = 0x23;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_1e8,str_06);
          v._M_str = (char *)__s1;
          v._M_len = __n;
          absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)local_1e8,v);
          goto LAB_001bd38d;
        }
      }
LAB_001bba4e:
      lVar19 = lVar19 + 1;
      pDVar20 = pDVar20 + 0x14;
    } while (iVar7 != lVar19);
  }
  psVar3 = local_2a8;
  __s1_00._M_head_impl = (LogMessageData *)(local_2a8->_M_dataplus)._M_p;
  pZVar22 = (ZeroCopyOutputStream *)local_2a8->_M_string_length;
  if (pZVar22 < (ZeroCopyOutputStream *)0x10) {
    if ((ZeroCopyOutputStream *)&DAT_00000006 < pZVar22) goto LAB_001bbaa0;
  }
  else {
    auVar27[0] = -(*(char *)__s1_00._M_head_impl == 'i');
    auVar27[1] = -(*(char *)((long)__s1_00._M_head_impl + 1) == 'n');
    auVar27[2] = -(*(char *)((long)__s1_00._M_head_impl + 2) == 's');
    auVar27[3] = -(*(char *)((long)__s1_00._M_head_impl + 3) == 'e');
    auVar27[4] = -(*(char *)((long)__s1_00._M_head_impl + 4) == 'r');
    auVar27[5] = -(*(char *)((long)__s1_00._M_head_impl + 5) == 't');
    auVar27[6] = -(*(char *)((long)__s1_00._M_head_impl + 6) == '_');
    auVar27[7] = -(*(char *)((long)__s1_00._M_head_impl + 7) == 'e');
    auVar27[8] = -(*(char *)((long)__s1_00._M_head_impl + 8) == 'n');
    auVar27[9] = -(*(char *)((long)__s1_00._M_head_impl + 9) == 'd');
    auVar27[10] = -(*(char *)((long)__s1_00._M_head_impl + 10) == 'l');
    auVar27[0xb] = -(*(char *)((long)__s1_00._M_head_impl + 0xb) == 'i');
    auVar27[0xc] = -(*(char *)((long)__s1_00._M_head_impl + 0xc) == 'n');
    auVar27[0xd] = -(*(char *)((long)__s1_00._M_head_impl + 0xd) == 'e');
    auVar27[0xe] = -(*(char *)((long)__s1_00._M_head_impl + 0xe) == 's');
    auVar27[0xf] = -(*(char *)((long)__s1_00._M_head_impl + 0xf) == '=');
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe | (ushort)(auVar27[0xf] >> 7) << 0xf
                ) == 0xffff) {
      pcVar23 = "insert_endlines=";
      local_2a8 = (string *)CONCAT44(local_2a8._4_4_,0xff01);
      goto LAB_001bc1d2;
    }
LAB_001bbaa0:
    if (*(int *)((long)__s1_00._M_head_impl + 3) == 0x3d747265 &&
        *(int *)__s1_00._M_head_impl == 0x65736e69) {
      local_2a8 = (string *)((ulong)local_2a8._4_4_ << 0x20);
      pcVar23 = "insert=";
LAB_001bc1d2:
      pZVar10 = (ZeroCopyOutputStream *)strlen(pcVar23);
      local_b8 = uVar21;
      if ((pZVar10 == (ZeroCopyOutputStream *)0x0) ||
         ((pZVar10 <= pZVar22 &&
          (iVar7 = bcmp(__s1_00._M_head_impl,pcVar23,(size_t)pZVar10), iVar7 == 0)))) {
        __s1_00._M_head_impl =
             (LogMessageData *)
             ((long)&pZVar10->_vptr_ZeroCopyOutputStream + (long)__s1_00._M_head_impl);
        pZVar22 = (ZeroCopyOutputStream *)((long)pZVar22 - (long)pZVar10);
      }
      local_1e8[0x10] = 0x2c;
      local_1e8._0_8_ = pZVar22;
      local_1e8._8_8_ = __s1_00;
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2d0,
                   (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_300,
                   (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)local_1e8);
      if (local_2d0._8_8_ != local_2d0._0_8_) {
        local_240 = &local_d8;
        local_238 = &local_f8;
        local_230 = local_118;
        local_228 = &local_138;
        local_220 = &local_150;
        lVar19 = 8;
        uVar21 = 0;
        do {
          GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_2a0,(Arena *)0x0);
          generator_name_00._M_str = (char *)0xc;
          generator_name_00._M_len = (size_t)(this->name_)._M_dataplus._M_p;
          pbVar15 = (Nonnull<std::string_*>)0xc;
          parameter_01._M_str = (char *)file;
          parameter_01._M_len = (size_t)"first_insert";
          pcVar23 = "first_insert";
          GetOutputFileContent_abi_cxx11_
                    ((string *)&local_270,(MockCodeGenerator *)(this->name_)._M_string_length,
                     generator_name_00,parameter_01,(FileDescriptor *)context,
                     in_stack_fffffffffffffce0);
          if ((char)local_2a8 != '\0') {
            local_1e8._0_8_ = (ZeroCopyOutputStream *)0x1;
            local_1e8._8_8_ = (long)"-+," + 2;
            local_1e8._16_8_ = (int *)0x2;
            local_1e8._24_8_ = ",\n";
            replacements._M_len = (size_type)&local_270;
            replacements._M_array = (iterator)0x1;
            absl::lts_20250127::StrReplaceAll((lts_20250127 *)local_1e8,replacements,pbVar15);
          }
          if ((local_b8 & 1) != 0) {
            pvVar11 = internal::RepeatedPtrFieldBase::AddMessageLite
                                ((RepeatedPtrFieldBase *)((AlphaNum *)local_2a0)->digits_,
                                 Arena::
                                 DefaultConstruct<google::protobuf::GeneratedCodeInfo_Annotation>);
            *(undefined4 *)((long)pvVar11 + 0x38) = 0;
            *(undefined4 *)((long)pvVar11 + 0x3c) =
                 (undefined4)local_270.super_Message.super_MessageLite._internal_metadata_.ptr_;
            *(uint *)((long)pvVar11 + 0x10) = *(uint *)((long)pvVar11 + 0x10) | 7;
            pAVar16 = *(Arena **)((long)pvVar11 + 8);
            if (((ulong)pAVar16 & 1) != 0) {
              pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
            }
            value._M_str = "first_path";
            value._M_len = 10;
            internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar11 + 0x30),value,pAVar16);
          }
          local_b0.piece_._M_str = *(char **)((char *)(local_2d0._0_8_ + 0x10) + lVar19 + -0x18);
          local_b0.piece_._M_len = *(size_t *)((char *)(local_2d0._0_8_ + 0x10) + lVar19 + -0x10);
          local_1e8._8_8_ = (file->name_->_M_dataplus)._M_p;
          local_1e8._0_8_ = file->name_->_M_string_length;
          local_300._0_8_ = &DAT_00000013;
          local_300._8_8_ = ".MockCodeGenerator.";
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)local_218,(lts_20250127 *)local_1e8,(AlphaNum *)local_300,&local_b0,
                     (AlphaNum *)pcVar23);
          local_300._0_8_ = (int *)0x1a;
          local_1e8._0_8_ = (ZeroCopyOutputStream *)(local_1e8 + 0x10);
          local_1e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1e8,(ulong)local_300);
          local_1e8._16_8_ = local_300._0_8_;
          builtin_strncpy((char *)((long)&((ZeroCopyOutputStream *)(local_1e8._0_8_ + 8))->
                                          _vptr_ZeroCopyOutputStream + 2),"_inserti",8);
          builtin_strncpy((char *)((long)&((ZeroCopyOutputStream *)(local_1e8._0_8_ + 0x10))->
                                          _vptr_ZeroCopyOutputStream + 2),"on_point",8);
          ((ZeroCopyOutputStream *)local_1e8._0_8_)->_vptr_ZeroCopyOutputStream =
               (_func_int **)0x6f6d5f7473726966;
          ((ZeroCopyOutputStream *)(local_1e8._0_8_ + 8))->_vptr_ZeroCopyOutputStream =
               (_func_int **)0x7265736e695f6b63;
          local_1e8._8_8_ = local_300._0_8_;
          *(char *)((long)&((ZeroCopyOutputStream *)local_1e8._0_8_)->_vptr_ZeroCopyOutputStream +
                   local_300._0_8_) = '\0';
          iVar7 = (*context->_vptr_GeneratorContext[5])(context,local_218,(Printer *)local_1e8);
          pZVar22 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar7);
          if ((ZeroCopyOutputStream *)local_1e8._0_8_ != (ZeroCopyOutputStream *)(local_1e8 + 0x10))
          {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
          }
          if ((AlphaNum *)local_218._0_8_ != (AlphaNum *)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          io::Printer::Printer((Printer *)local_1e8,pZVar22,'$',(AnnotationCollector *)0x0);
          io::Printer::WriteRaw
                    ((Printer *)local_1e8,
                     (char *)local_270.super_Message.super_MessageLite._vptr_MessageLite,
                     CONCAT44(local_270.super_Message.super_MessageLite._internal_metadata_.ptr_.
                              _4_4_,(undefined4)
                                    local_270.super_Message.super_MessageLite._internal_metadata_.
                                    ptr_));
          if ((bool)local_1e8[0x71] == true) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_2b0,0,(char *)local_2b0->_M_string_length,0x3aecb3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_240);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::~raw_hash_set(local_238);
            (*(code *)local_118._16_8_)(1,local_230);
            std::
            vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
            ::~vector(local_228);
            std::
            vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
            ::~vector(local_220);
            if ((pointer)local_1e8._128_8_ != (pointer)0x0) {
              operator_delete((void *)local_1e8._128_8_,local_1e8._144_8_ - local_1e8._128_8_);
            }
            if ((int *)local_1e8._16_8_ != (int *)0x0) {
              (*(*(_func_int ***)local_1e8._0_8_)[3])();
            }
LAB_001bcace:
            if (pZVar22 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar22->_vptr_ZeroCopyOutputStream[1])(pZVar22);
            }
            if ((anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)
                local_270.super_Message.super_MessageLite._vptr_MessageLite != &local_270.field_0) {
              operator_delete(local_270.super_Message.super_MessageLite._vptr_MessageLite,
                              (long)local_270.field_0._impl_.annotation_.super_RepeatedPtrFieldBase.
                                    tagged_rep_or_elem_ + 1);
            }
            GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_2a0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2d0);
            return false;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(local_240);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::~raw_hash_set(local_238);
          (*(code *)local_118._16_8_)(1,local_230);
          std::
          vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
          ::~vector(local_228);
          std::
          vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
          ::~vector(local_220);
          if ((pointer)local_1e8._128_8_ != (pointer)0x0) {
            operator_delete((void *)local_1e8._128_8_,local_1e8._144_8_ - local_1e8._128_8_);
          }
          if ((int *)local_1e8._16_8_ != (int *)0x0) {
            (*(*(_func_int ***)local_1e8._0_8_)[3])();
          }
          if (pZVar22 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar22->_vptr_ZeroCopyOutputStream[1])(pZVar22);
          }
          if ((anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)
              local_270.super_Message.super_MessageLite._vptr_MessageLite != &local_270.field_0) {
            operator_delete(local_270.super_Message.super_MessageLite._vptr_MessageLite,
                            (long)local_270.field_0._impl_.annotation_.super_RepeatedPtrFieldBase.
                                  tagged_rep_or_elem_ + 1);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_2a0);
          GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_2a0,(Arena *)0x0);
          generator_name_01._M_str = (char *)0xd;
          generator_name_01._M_len = (size_t)(this->name_)._M_dataplus._M_p;
          pbVar15 = (Nonnull<std::string_*>)0xd;
          parameter_02._M_str = (char *)file;
          parameter_02._M_len = (size_t)"second_insert";
          pcVar23 = "second_insert";
          GetOutputFileContent_abi_cxx11_
                    ((string *)&local_270,(MockCodeGenerator *)(this->name_)._M_string_length,
                     generator_name_01,parameter_02,(FileDescriptor *)context,
                     in_stack_fffffffffffffce0);
          if ((char)local_2a8 != '\0') {
            local_1e8._0_8_ = (ZeroCopyOutputStream *)0x1;
            local_1e8._8_8_ = ",";
            local_1e8._16_8_ = (int *)0x2;
            local_1e8._24_8_ = ",\n";
            replacements_00._M_len = (size_type)&local_270;
            replacements_00._M_array = (iterator)0x1;
            absl::lts_20250127::StrReplaceAll((lts_20250127 *)local_1e8,replacements_00,pbVar15);
          }
          if ((local_b8 & 1) != 0) {
            pvVar11 = internal::RepeatedPtrFieldBase::AddMessageLite
                                ((RepeatedPtrFieldBase *)((AlphaNum *)local_2a0)->digits_,
                                 Arena::
                                 DefaultConstruct<google::protobuf::GeneratedCodeInfo_Annotation>);
            *(undefined4 *)((long)pvVar11 + 0x38) = 0;
            *(undefined4 *)((long)pvVar11 + 0x3c) =
                 (undefined4)local_270.super_Message.super_MessageLite._internal_metadata_.ptr_;
            *(uint *)((long)pvVar11 + 0x10) = *(uint *)((long)pvVar11 + 0x10) | 7;
            pAVar16 = *(Arena **)((long)pvVar11 + 8);
            if (((ulong)pAVar16 & 1) != 0) {
              pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
            }
            value_00._M_str = "second_path";
            value_00._M_len = 0xb;
            internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar11 + 0x30),value_00,pAVar16)
            ;
          }
          local_b0.piece_._M_str = *(char **)((char *)(local_2d0._0_8_ + 0x10) + lVar19 + -0x18);
          local_b0.piece_._M_len = *(size_t *)((char *)(local_2d0._0_8_ + 0x10) + lVar19 + -0x10);
          local_1e8._8_8_ = (file->name_->_M_dataplus)._M_p;
          local_1e8._0_8_ = file->name_->_M_string_length;
          local_300._0_8_ = &DAT_00000013;
          local_300._8_8_ = ".MockCodeGenerator.";
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)local_218,(lts_20250127 *)local_1e8,(AlphaNum *)local_300,&local_b0,
                     (AlphaNum *)pcVar23);
          local_300._0_8_ = (int *)0x1b;
          local_1e8._0_8_ = (ZeroCopyOutputStream *)(local_1e8 + 0x10);
          local_1e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1e8,(ulong)local_300);
          local_1e8._16_8_ = local_300._0_8_;
          builtin_strncpy((char *)((long)&((ZeroCopyOutputStream *)(local_1e8._0_8_ + 8))->
                                          _vptr_ZeroCopyOutputStream + 3),"_inserti",8);
          builtin_strncpy((char *)((long)&((ZeroCopyOutputStream *)(local_1e8._0_8_ + 0x10))->
                                          _vptr_ZeroCopyOutputStream + 3),"on_point",8);
          ((ZeroCopyOutputStream *)local_1e8._0_8_)->_vptr_ZeroCopyOutputStream =
               (_func_int **)0x6d5f646e6f636573;
          ((ZeroCopyOutputStream *)(local_1e8._0_8_ + 8))->_vptr_ZeroCopyOutputStream =
               (_func_int **)0x65736e695f6b636f;
          local_1e8._8_8_ = local_300._0_8_;
          *(char *)((long)&((ZeroCopyOutputStream *)local_1e8._0_8_)->_vptr_ZeroCopyOutputStream +
                   local_300._0_8_) = '\0';
          iVar7 = (*context->_vptr_GeneratorContext[5])(context,local_218,(Printer *)local_1e8);
          pZVar22 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar7);
          if ((ZeroCopyOutputStream *)local_1e8._0_8_ != (ZeroCopyOutputStream *)(local_1e8 + 0x10))
          {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
          }
          if ((AlphaNum *)local_218._0_8_ != (AlphaNum *)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          io::Printer::Printer((Printer *)local_1e8,pZVar22,'$',(AnnotationCollector *)0x0);
          io::Printer::WriteRaw
                    ((Printer *)local_1e8,
                     (char *)local_270.super_Message.super_MessageLite._vptr_MessageLite,
                     CONCAT44(local_270.super_Message.super_MessageLite._internal_metadata_.ptr_.
                              _4_4_,(undefined4)
                                    local_270.super_Message.super_MessageLite._internal_metadata_.
                                    ptr_));
          if ((bool)local_1e8[0x71] == true) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_2b0,0,(char *)local_2b0->_M_string_length,0x3aecb3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_240);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::~raw_hash_set(local_238);
            (*(code *)local_118._16_8_)(1,local_230);
            std::
            vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
            ::~vector(local_228);
            std::
            vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
            ::~vector(local_220);
            if ((pointer)local_1e8._128_8_ != (pointer)0x0) {
              operator_delete((void *)local_1e8._128_8_,local_1e8._144_8_ - local_1e8._128_8_);
            }
            if ((int *)local_1e8._16_8_ != (int *)0x0) {
              (*(*(_func_int ***)local_1e8._0_8_)[3])();
            }
            goto LAB_001bcace;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(local_240);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::~raw_hash_set(local_238);
          (*(code *)local_118._16_8_)(1,local_230);
          std::
          vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
          ::~vector(local_228);
          std::
          vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
          ::~vector(local_220);
          if ((pointer)local_1e8._128_8_ != (pointer)0x0) {
            operator_delete((void *)local_1e8._128_8_,local_1e8._144_8_ - local_1e8._128_8_);
          }
          if ((int *)local_1e8._16_8_ != (int *)0x0) {
            (*(*(_func_int ***)local_1e8._0_8_)[3])();
          }
          if (pZVar22 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar22->_vptr_ZeroCopyOutputStream[1])(pZVar22);
          }
          if ((anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)
              local_270.super_Message.super_MessageLite._vptr_MessageLite != &local_270.field_0) {
            operator_delete(local_270.super_Message.super_MessageLite._vptr_MessageLite,
                            (long)local_270.field_0._impl_.annotation_.super_RepeatedPtrFieldBase.
                                  tagged_rep_or_elem_ + 1);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_2a0);
          uVar21 = uVar21 + 1;
          lVar19 = lVar19 + 0x20;
        } while (uVar21 < (ulong)((long)(local_2d0._8_8_ - local_2d0._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d0);
      return true;
    }
  }
  local_b0.piece_._M_str = (this->name_)._M_dataplus._M_p;
  local_b0.piece_._M_len = (this->name_)._M_string_length;
  local_1e8._8_8_ = (file->name_->_M_dataplus)._M_p;
  local_1e8._0_8_ = file->name_->_M_string_length;
  local_300._0_8_ = &DAT_00000013;
  local_300._8_8_ = ".MockCodeGenerator.";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_2a0,(lts_20250127 *)local_1e8,(AlphaNum *)local_300,&local_b0,
             (AlphaNum *)error);
  iVar7 = (*context->_vptr_GeneratorContext[2])();
  pZVar22 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar7);
  pcVar23 = ((AlphaNum *)local_2a0)->digits_;
  if ((char *)local_2a0._0_8_ != pcVar23) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  GeneratedCodeInfo::GeneratedCodeInfo(&local_270,(Arena *)0x0);
  local_40._vptr_AnnotationCollector = (_func_int **)&PTR__AnnotationCollector_0056c8d8;
  annotation_collector_00 = (AnnotationCollector *)0x0;
  if (uVar21 != 0) {
    annotation_collector_00 = &local_40;
  }
  local_38 = &local_270;
  io::Printer::Printer((Printer *)local_1e8,pZVar22,'$',annotation_collector_00);
  generator_name._M_str = (char *)psVar3->_M_string_length;
  generator_name._M_len = (size_t)(this->name_)._M_dataplus._M_p;
  parameter_00._M_str = (char *)file;
  parameter_00._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
  GetOutputFileContent_abi_cxx11_
            ((string *)local_300,(MockCodeGenerator *)(this->name_)._M_string_length,generator_name,
             parameter_00,(FileDescriptor *)context,in_stack_fffffffffffffce0);
  io::Printer::WriteRaw((Printer *)local_1e8,(char *)local_300._0_8_,local_300._8_8_);
  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"_annotation","");
  if (uVar21 != 0) {
    text._M_str = "$p$\n";
    text._M_len = 4;
    io::Printer::Print<char[2],char[6]>
              ((Printer *)local_1e8,text,(char (*) [2])0x4970a4,(char (*) [6])0x3e104c);
    local_300._0_8_ = (char *)0x5;
    local_300._8_8_ = (long)"parent == symbol.parent_name_key().first" + 0x23;
    local_b0.piece_._M_len = local_2d0._8_8_;
    local_b0.piece_._M_str = (char *)local_2d0._0_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_2a0,(lts_20250127 *)local_300,&local_b0,(AlphaNum *)local_2d0._8_8_);
    local_218._0_8_ = local_2a0._8_8_;
    local_218._8_8_ = local_2a0._0_8_;
    file_name._M_str = (char *)local_2a0._0_8_;
    file_name._M_len = local_2a0._8_8_;
    begin_varname._M_str = "p";
    begin_varname._M_len = 1;
    end_varname._M_str = "p";
    end_varname._M_len = 1;
    io::Printer::Annotate
              ((Printer *)local_1e8,begin_varname,end_varname,file_name,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    if ((char *)local_2a0._0_8_ != pcVar23) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
  }
  io::Printer::WriteRaw
            ((Printer *)local_1e8,"# @@protoc_insertion_point(first_mock_insertion_point) is here\n"
             ,0x3f);
  if (uVar21 != 0) {
    text_00._M_str = "$p$\n";
    text_00._M_len = 4;
    io::Printer::Print<char[2],char[7]>
              ((Printer *)local_1e8,text_00,(char (*) [2])0x4970a4,(char (*) [7])0x3e1022);
    local_300._0_8_ = &DAT_00000006;
    local_300._8_8_ = (long)"name == symbol.parent_name_key().second" + 0x21;
    local_b0.piece_._M_len = local_2d0._8_8_;
    local_b0.piece_._M_str = (char *)local_2d0._0_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_2a0,(lts_20250127 *)local_300,&local_b0,(AlphaNum *)local_2d0._8_8_);
    local_218._0_8_ = local_2a0._8_8_;
    local_218._8_8_ = local_2a0._0_8_;
    file_name_00._M_str = (char *)local_2a0._0_8_;
    file_name_00._M_len = local_2a0._8_8_;
    begin_varname_00._M_str = "p";
    begin_varname_00._M_len = 1;
    end_varname_00._M_str = "p";
    end_varname_00._M_len = 1;
    io::Printer::Annotate
              ((Printer *)local_1e8,begin_varname_00,end_varname_00,file_name_00,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    if ((char *)local_2a0._0_8_ != pcVar23) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
  }
  io::Printer::WriteRaw
            ((Printer *)local_1e8,
             "  # @@protoc_insertion_point(second_mock_insertion_point) is here\n",0x42);
  if (uVar21 == 0) {
    if ((bool)local_1e8[0x71] != true) {
LAB_001bc0ed:
      if ((pointer)local_2d0._0_8_ != (pointer)(local_2d0 + 0x10)) {
        operator_delete((void *)local_2d0._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_2d0._16_8_)->_M_p + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::~raw_hash_set(&local_f8);
      (*(code *)local_118._16_8_)(1,local_118);
      std::
      vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ::~vector(&local_138);
      std::
      vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ::~vector(&local_150);
      if ((pointer)local_1e8._128_8_ != (pointer)0x0) {
        operator_delete((void *)local_1e8._128_8_,local_1e8._144_8_ - local_1e8._128_8_);
      }
      if (local_1e8._16_8_ != 0) {
        (*(*(_func_int ***)local_1e8._0_8_)[3])();
      }
      GeneratedCodeInfo::~GeneratedCodeInfo(&local_270);
      if (pZVar22 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar22->_vptr_ZeroCopyOutputStream[1])(pZVar22);
        return true;
      }
      return true;
    }
  }
  else {
    text_01._M_str = "$p$\n";
    text_01._M_len = 4;
    io::Printer::Print<char[2],char[6]>
              ((Printer *)local_1e8,text_01,(char (*) [2])0x4970a4,(char (*) [6])"third");
    local_300._0_8_ = (char *)0x5;
    local_300._8_8_ = "third";
    local_b0.piece_._M_len = local_2d0._8_8_;
    local_b0.piece_._M_str = (char *)local_2d0._0_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_2a0,(lts_20250127 *)local_300,&local_b0,(AlphaNum *)local_2d0._8_8_);
    local_218._0_8_ = local_2a0._8_8_;
    local_218._8_8_ = local_2a0._0_8_;
    file_name_01._M_str = (char *)local_2a0._0_8_;
    file_name_01._M_len = local_2a0._8_8_;
    begin_varname_01._M_str = "p";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "p";
    end_varname_01._M_len = 1;
    c = (AlphaNum *)0x4970a4;
    io::Printer::Annotate
              ((Printer *)local_1e8,begin_varname_01,end_varname_01,file_name_01,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    if ((char *)local_2a0._0_8_ != pcVar23) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    if ((bool)local_1e8[0x71] == false) {
      local_2a0._8_8_ = (this->name_)._M_dataplus._M_p;
      local_2a0._0_8_ = (this->name_)._M_string_length;
      local_300._8_8_ = (file->name_->_M_dataplus)._M_p;
      local_300._0_8_ = file->name_->_M_string_length;
      local_b0.piece_._M_len = (size_t)&DAT_00000013;
      local_b0.piece_._M_str = ".MockCodeGenerator.";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_80,(lts_20250127 *)local_300,&local_b0,(AlphaNum *)local_2a0,c);
      local_218._0_8_ = local_80._M_string_length;
      local_218._8_8_ = local_80._M_dataplus._M_p;
      local_300._0_8_ = (char *)0x8;
      local_300._8_8_ = (long)"MockCodeGenerator couldn\'t write .pb.meta" + 0x21;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_60,(lts_20250127 *)local_218,(AlphaNum *)local_300,
                 (AlphaNum *)local_80._M_string_length);
      iVar7 = (*context->_vptr_GeneratorContext[2])(context,&local_60);
      pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar4 = TextFormat::Print(&local_270.super_Message,pZVar10);
      if (bVar4) {
        if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
        }
        goto LAB_001bc0ed;
      }
      std::__cxx11::string::operator=
                ((string *)local_2b0,"MockCodeGenerator couldn\'t write .pb.meta");
      if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
      }
      goto LAB_001bc02e;
    }
  }
  std::__cxx11::string::_M_replace((ulong)local_2b0,0,(char *)local_2b0->_M_string_length,0x3aecb3);
LAB_001bc02e:
  if ((pointer)local_2d0._0_8_ != (pointer)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2d0._16_8_)->_M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~raw_hash_set(&local_f8);
  (*(code *)local_118._16_8_)(1,local_118);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_138);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_150);
  if ((pointer)local_1e8._128_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._128_8_,local_1e8._144_8_ - local_1e8._128_8_);
  }
  if (local_1e8._16_8_ != 0) {
    (*(*(_func_int ***)local_1e8._0_8_)[3])();
  }
  GeneratedCodeInfo::~GeneratedCodeInfo(&local_270);
  if (pZVar22 != (ZeroCopyOutputStream *)0x0) {
    (*pZVar22->_vptr_ZeroCopyOutputStream[1])(pZVar22);
  }
  return false;
}

Assistant:

bool MockCodeGenerator::Generate(const FileDescriptor* file,
                                 const std::string& parameter,
                                 GeneratorContext* context,
                                 std::string* error) const {
  // Override minimum/maximum after generating the pool to simulate a plugin
  // that "works" but doesn't advertise support of the current edition.
  absl::string_view test_case = GetTestCase();
  if (test_case == "high_minimum") {
    minimum_edition_ = Edition::EDITION_99997_TEST_ONLY;
  } else if (test_case == "low_maximum") {
    maximum_edition_ = Edition::EDITION_PROTO2;
  }

  if (GetEdition(*file) >= Edition::EDITION_2023 &&
      (suppressed_features_ & CodeGenerator::FEATURE_SUPPORTS_EDITIONS) == 0) {
    internal::VisitDescriptors(*file, [&](const auto& descriptor) {
      const FeatureSet& features = GetResolvedSourceFeatures(descriptor);
      ABSL_CHECK(features.HasExtension(pb::test))
          << "Test features were not resolved properly";
      ABSL_CHECK(features.GetExtension(pb::test).has_file_feature())
          << "Test features were not resolved properly";
      ABSL_CHECK(features.GetExtension(pb::test).has_source_feature())
          << "Test features were not resolved properly";
    });
  }

  bool annotate = false;
  for (int i = 0; i < file->message_type_count(); i++) {
    if (absl::StartsWith(file->message_type(i)->name(), "MockCodeGenerator_")) {
      absl::string_view command = absl::StripPrefix(
          file->message_type(i)->name(), "MockCodeGenerator_");
      if (command == "Error") {
        *error = "Saw message type MockCodeGenerator_Error.";
        return false;
      }
      if (command == "Exit") {
        std::cerr << "Saw message type MockCodeGenerator_Exit." << std::endl;
        exit(123);
      }
      ABSL_CHECK(command != "Abort")
          << "Saw message type MockCodeGenerator_Abort.";
      if (command == "HasSourceCodeInfo") {
        FileDescriptorProto file_descriptor_proto;
        file->CopySourceCodeInfoTo(&file_descriptor_proto);
        bool has_source_code_info =
            file_descriptor_proto.has_source_code_info() &&
            file_descriptor_proto.source_code_info().location_size() > 0;
        ABSL_LOG(FATAL)
            << "Saw message type MockCodeGenerator_HasSourceCodeInfo: "
            << has_source_code_info << ".";
      } else if (command == "HasJsonName") {
        FieldDescriptorProto field_descriptor_proto;
        file->message_type(i)->field(0)->CopyTo(&field_descriptor_proto);
        ABSL_LOG(FATAL) << "Saw json_name: "
                        << field_descriptor_proto.has_json_name();
      } else if (command == "Annotate") {
        annotate = true;
      } else if (command == "ShowVersionNumber") {
        Version compiler_version;
        context->GetCompilerVersion(&compiler_version);
        ABSL_LOG(FATAL) << "Saw compiler_version: "
                        << compiler_version.major() * 1000000 +
                               compiler_version.minor() * 1000 +
                               compiler_version.patch()
                        << " " << compiler_version.suffix();
      } else {
        ABSL_LOG(FATAL) << "Unknown MockCodeGenerator command: " << command;
      }
    }
  }

  bool insert_endlines = absl::StartsWith(parameter, "insert_endlines=");
  if (insert_endlines || absl::StartsWith(parameter, "insert=")) {
    std::vector<std::string> insert_into = absl::StrSplit(
        absl::StripPrefix(parameter,
                          insert_endlines ? "insert_endlines=" : "insert="),
        ',', absl::SkipEmpty());

    for (size_t i = 0; i < insert_into.size(); i++) {
      {
        google::protobuf::GeneratedCodeInfo info;
        std::string content =
            GetOutputFileContent(name_, "first_insert", file, context);
        if (insert_endlines) {
          absl::StrReplaceAll({{",", ",\n"}}, &content);
        }
        if (annotate) {
          auto* annotation = info.add_annotation();
          annotation->set_begin(0);
          annotation->set_end(content.size());
          annotation->set_source_file("first_path");
        }
        std::unique_ptr<io::ZeroCopyOutputStream> output(
            context->OpenForInsertWithGeneratedCodeInfo(
                GetOutputFileName(insert_into[i], file),
                std::string(kFirstInsertionPointName), info));
        io::Printer printer(output.get(), '$');
        printer.PrintRaw(content);
        if (printer.failed()) {
          *error = "MockCodeGenerator detected write error.";
          return false;
        }
      }

      {
        google::protobuf::GeneratedCodeInfo info;
        std::string content =
            GetOutputFileContent(name_, "second_insert", file, context);
        if (insert_endlines) {
          absl::StrReplaceAll({{",", ",\n"}}, &content);
        }
        if (annotate) {
          auto* annotation = info.add_annotation();
          annotation->set_begin(0);
          annotation->set_end(content.size());
          annotation->set_source_file("second_path");
        }
        std::unique_ptr<io::ZeroCopyOutputStream> output(
            context->OpenForInsertWithGeneratedCodeInfo(
                GetOutputFileName(insert_into[i], file),
                std::string(kSecondInsertionPointName), info));
        io::Printer printer(output.get(), '$');
        printer.PrintRaw(content);
        if (printer.failed()) {
          *error = "MockCodeGenerator detected write error.";
          return false;
        }
      }
    }
  } else {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(GetOutputFileName(name_, file)));

    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(output.get(), '$',
                        annotate ? &annotation_collector : nullptr);
    printer.PrintRaw(GetOutputFileContent(name_, parameter, file, context));
    std::string annotate_suffix = "_annotation";
    if (annotate) {
      printer.Print("$p$\n", "p", "first");
      printer.Annotate("p", absl::StrCat("first", annotate_suffix));
    }
    printer.PrintRaw(kFirstInsertionPoint);
    if (annotate) {
      printer.Print("$p$\n", "p", "second");
      printer.Annotate("p", absl::StrCat("second", annotate_suffix));
    }
    printer.PrintRaw(kSecondInsertionPoint);
    if (annotate) {
      printer.Print("$p$\n", "p", "third");
      printer.Annotate("p", absl::StrCat("third", annotate_suffix));
    }

    if (printer.failed()) {
      *error = "MockCodeGenerator detected write error.";
      return false;
    }
    if (annotate) {
      std::unique_ptr<io::ZeroCopyOutputStream> meta_output(context->Open(
          absl::StrCat(GetOutputFileName(name_, file), ".pb.meta")));
      if (!TextFormat::Print(annotations, meta_output.get())) {
        *error = "MockCodeGenerator couldn't write .pb.meta";
        return false;
      }
    }
  }

  return true;
}